

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

deUint64 deqp::gles3::Performance::anon_unknown_1::medianTimeMemcpy
                   (void *dst,void *src,int numBytes)

{
  deInt32 dVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  float local_e4;
  float local_dc;
  deUint64 endTime_1;
  deUint64 startTime_1;
  int local_c0;
  int sectionNdx_2;
  int sectionNdx_1;
  int sectionNdx;
  deUint64 bestTime;
  deUint64 medianTime;
  deUint64 sectionTimes [5];
  int aiStack_78 [2];
  int sectionLens [5];
  deInt32 dStack_58;
  int iStack_54;
  int sectionStarts [6];
  int sectionAlign;
  int numSections;
  deUint64 endTime;
  deUint64 startTime;
  int numBytes_local;
  void *src_local;
  void *dst_local;
  
  if (numBytes < 0x100000) {
    deYield();
    dVar2 = deGetMicroseconds();
    ::deMemcpy(dst,src,(long)numBytes);
    dVar3 = deGetMicroseconds();
    dst_local = (void *)(dVar3 - dVar2);
  }
  else {
    sectionStarts[5] = 5;
    sectionStarts[4] = 0x10;
    _sectionNdx_1 = 0;
    for (sectionNdx_2 = 0; sectionNdx_2 < 5; sectionNdx_2 = sectionNdx_2 + 1) {
      dVar1 = deAlign32((numBytes * sectionNdx_2) / 5,0x10);
      (&dStack_58)[sectionNdx_2] = dVar1;
    }
    sectionStarts[3] = numBytes;
    for (local_c0 = 0; local_c0 < 5; local_c0 = local_c0 + 1) {
      aiStack_78[local_c0] = (&dStack_58)[local_c0 + 1] - (&dStack_58)[local_c0];
    }
    deYield();
    tcu::warmupCPU();
    deYield();
    for (startTime_1._4_4_ = 0; startTime_1._4_4_ < 5; startTime_1._4_4_ = startTime_1._4_4_ + 1) {
      dVar2 = deGetMicroseconds();
      ::deMemcpy((void *)((long)dst + (long)(&dStack_58)[startTime_1._4_4_]),
                 (void *)((long)src + (long)(&dStack_58)[startTime_1._4_4_]),
                 (long)aiStack_78[startTime_1._4_4_]);
      dVar3 = deGetMicroseconds();
      sectionTimes[(long)startTime_1._4_4_ + -1] = dVar3 - dVar2;
      if ((_sectionNdx_1 == 0) || (sectionTimes[(long)startTime_1._4_4_ + -1] < _sectionNdx_1)) {
        _sectionNdx_1 = sectionTimes[(long)startTime_1._4_4_ + -1];
      }
      if (startTime_1._4_4_ != 4) {
        local_dc = (float)sectionTimes[(long)startTime_1._4_4_ + -1];
        local_e4 = (float)_sectionNdx_1;
        if (local_e4 * 1.5 < local_dc) {
          deYield();
          tcu::warmupCPU();
          deYield();
        }
      }
    }
    std::sort<unsigned_long*>(&medianTime,sectionTimes + 4);
    dst_local = (void *)(sectionTimes[1] * 5);
  }
  return (deUint64)dst_local;
}

Assistant:

static deUint64 medianTimeMemcpy (void* dst, const void* src, int numBytes)
{
	// Time used by memcpy is assumed to be asymptotically linear

	// With large numBytes, the probability of context switch or other random
	// event is high. Apply memcpy in parts and report how much time would
	// memcpy have used with the median transfer rate.

	// Less than 1MiB, no need to do anything special
	if (numBytes < 1048576)
	{
		deUint64 startTime;
		deUint64 endTime;

		deYield();

		startTime = deGetMicroseconds();
		deMemcpy(dst, src, numBytes);
		endTime = deGetMicroseconds();

		return endTime - startTime;
	}
	else
	{
		// Do memcpy in multiple parts

		const int	numSections		= 5;
		const int	sectionAlign	= 16;

		int			sectionStarts[numSections+1];
		int			sectionLens[numSections];
		deUint64	sectionTimes[numSections];
		deUint64	medianTime;
		deUint64	bestTime		= 0;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionStarts[sectionNdx] = deAlign32((numBytes * sectionNdx / numSections), sectionAlign);
		sectionStarts[numSections] = numBytes;

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
			sectionLens[sectionNdx] = sectionStarts[sectionNdx+1] - sectionStarts[sectionNdx];

		// Memcpy is usually called after mapbuffer range which may take
		// a lot of time. To prevent power management from kicking in during
		// copy, warm up more.
		{
			deYield();
			tcu::warmupCPU();
			deYield();
		}

		for (int sectionNdx = 0; sectionNdx < numSections; ++sectionNdx)
		{
			deUint64 startTime;
			deUint64 endTime;

			startTime = deGetMicroseconds();
			deMemcpy((deUint8*)dst + sectionStarts[sectionNdx], (const deUint8*)src + sectionStarts[sectionNdx], sectionLens[sectionNdx]);
			endTime = deGetMicroseconds();

			sectionTimes[sectionNdx] = endTime - startTime;

			if (!bestTime || sectionTimes[sectionNdx] < bestTime)
				bestTime = sectionTimes[sectionNdx];

			// Detect if write takes 50% longer than it should, and warm up if that happened
			if (sectionNdx != numSections-1 && (float)sectionTimes[sectionNdx] > 1.5f * (float)bestTime)
			{
				deYield();
				tcu::warmupCPU();
				deYield();
			}
		}

		std::sort(sectionTimes, sectionTimes + numSections);

		if ((numSections % 2) == 0)
			medianTime = (sectionTimes[numSections / 2 - 1] + sectionTimes[numSections / 2]) / 2;
		else
			medianTime = sectionTimes[numSections / 2];

		return medianTime*numSections;
	}
}